

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

void Wln_NtkCreateRefs(Wln_Ntk_t *p)

{
  int iVar1;
  undefined4 local_18;
  int iFanin;
  int iObj;
  int k;
  Wln_Ntk_t *p_local;
  
  Wln_NtkCleanRefs(p);
  for (local_18 = 1; iVar1 = Wln_NtkObjNum(p), local_18 < iVar1; local_18 = local_18 + 1) {
    for (iFanin = 0; iVar1 = Wln_ObjFaninNum(p,local_18), iFanin < iVar1; iFanin = iFanin + 1) {
      iVar1 = Wln_ObjFanin(p,local_18,iFanin);
      if (iVar1 != 0) {
        Wln_ObjRefsInc(p,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Wln_NtkCreateRefs( Wln_Ntk_t * p )  
{
    int k, iObj, iFanin;
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjRefsInc( p, iFanin );
}